

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O0

Result __thiscall
tonk::UDPSocket::InjectRecvfrom(UDPSocket *this,UDPAddress *addr,uint8_t *data,uint bytes)

{
  BufferResult BVar1;
  Allocator *pAVar2;
  void *in_RCX;
  long in_RSI;
  ErrorResult *in_RDI;
  uint in_R8D;
  uint in_stack_0000001c;
  uint8_t *in_stack_00000020;
  UDPAddress *in_stack_00000028;
  uint64_t in_stack_00000030;
  UDPSocket *in_stack_00000038;
  BufferResult result;
  uint8_t *buffer;
  uint64_t receiveUsec;
  Locker locker;
  Locker locker_1;
  Lock *in_stack_ffffffffffffff38;
  Locker *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  uint bytes_00;
  
  bytes_00 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pAVar2 = (Allocator *)siamese::GetTimeUsec();
  Locker::Locker(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pAVar2 = (Allocator *)pktalloc::Allocator::Allocate(pAVar2,bytes_00);
  Locker::~Locker((Locker *)0x1f9b06);
  if (pAVar2 == (Allocator *)0x0) {
    Result::OutOfMemory();
  }
  else {
    memcpy(pAVar2,in_RCX,(ulong)in_R8D);
    BVar1 = onUDPDatagram(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                          in_stack_0000001c);
    if (BVar1 == Free) {
      Locker::Locker(in_stack_ffffffffffffff40,*(Lock **)(in_RSI + 0x80));
      pktalloc::Allocator::Free(pAVar2,(uint8_t *)CONCAT44(BVar1,in_stack_ffffffffffffff70));
      Locker::~Locker((Locker *)0x1f9bf7);
    }
    Result::Success();
  }
  return (Result)in_RDI;
}

Assistant:

Result UDPSocket::InjectRecvfrom(
    const UDPAddress& addr,
    const uint8_t* data,
    unsigned bytes)
{
    // Grab the receive timestamp right away
    const uint64_t receiveUsec = siamese::GetTimeUsec();

    uint8_t* buffer = Deps.ReadBufferAllocator->Allocate(bytes);
    if (!buffer) {
        return Result::OutOfMemory();
    }
    memcpy(buffer, data, bytes);

    const BufferResult result = onUDPDatagram(receiveUsec, addr, buffer, bytes);
    if (result == BufferResult::Free) {
        Deps.ReadBufferAllocator->Free(buffer);
    }

    return Result::Success();
}